

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O0

yajl_tok yajl_lex_string(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t *offset)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  yajl_tok yVar4;
  size_t sVar5;
  uchar *puVar6;
  size_t sVar7;
  ulong *in_RCX;
  ulong in_RDX;
  uchar *in_RSI;
  yajl_lexer in_RDI;
  yajl_tok t;
  uint i;
  size_t len;
  uchar *p;
  uchar curChar;
  int hasEscapes;
  yajl_tok tok;
  uint local_44;
  yajl_tok yVar8;
  
  yVar8 = yajl_tok_error;
  bVar3 = false;
  while( true ) {
    while( true ) {
      if (((in_RDI->bufInUse == 0) || (sVar5 = yajl_buf_len(in_RDI->buf), sVar5 == 0)) ||
         (uVar2 = in_RDI->bufOff, sVar5 = yajl_buf_len(in_RDI->buf), sVar5 <= uVar2)) {
        if (*in_RCX < in_RDX) {
          sVar5 = yajl_string_scan(in_RSI + *in_RCX,in_RDX - *in_RCX,in_RDI->validateUTF8);
          *in_RCX = sVar5 + *in_RCX;
        }
      }
      else {
        puVar6 = yajl_buf_data(in_RDI->buf);
        sVar5 = in_RDI->bufOff;
        sVar7 = yajl_buf_len(in_RDI->buf);
        sVar5 = yajl_string_scan(puVar6 + sVar5,sVar7 - in_RDI->bufOff,in_RDI->validateUTF8);
        in_RDI->bufOff = sVar5 + in_RDI->bufOff;
      }
      if (in_RDX <= *in_RCX) {
        yVar8 = yajl_tok_eof;
        goto LAB_00103c2b;
      }
      if (((in_RDI->bufInUse == 0) || (sVar5 = yajl_buf_len(in_RDI->buf), sVar5 == 0)) ||
         (uVar2 = in_RDI->bufOff, sVar5 = yajl_buf_len(in_RDI->buf), sVar5 <= uVar2)) {
        uVar2 = *in_RCX;
        *in_RCX = uVar2 + 1;
        bVar1 = in_RSI[uVar2];
      }
      else {
        puVar6 = yajl_buf_data(in_RDI->buf);
        sVar5 = in_RDI->bufOff;
        in_RDI->bufOff = sVar5 + 1;
        bVar1 = puVar6[sVar5];
      }
      if (bVar1 == 0x22) {
        yVar8 = yajl_tok_string;
        goto LAB_00103c2b;
      }
      if (bVar1 != 0x5c) break;
      bVar3 = true;
      if (in_RDX <= *in_RCX) {
        yVar8 = yajl_tok_eof;
        goto LAB_00103c2b;
      }
      if (((in_RDI->bufInUse == 0) || (sVar5 = yajl_buf_len(in_RDI->buf), sVar5 == 0)) ||
         (uVar2 = in_RDI->bufOff, sVar5 = yajl_buf_len(in_RDI->buf), sVar5 <= uVar2)) {
        uVar2 = *in_RCX;
        *in_RCX = uVar2 + 1;
        bVar1 = in_RSI[uVar2];
      }
      else {
        puVar6 = yajl_buf_data(in_RDI->buf);
        sVar5 = in_RDI->bufOff;
        in_RDI->bufOff = sVar5 + 1;
        bVar1 = puVar6[sVar5];
      }
      if (bVar1 == 0x75) {
        for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
          if (in_RDX <= *in_RCX) {
            yVar8 = yajl_tok_eof;
            goto LAB_00103c2b;
          }
          if (((in_RDI->bufInUse == 0) || (sVar5 = yajl_buf_len(in_RDI->buf), sVar5 == 0)) ||
             (uVar2 = in_RDI->bufOff, sVar5 = yajl_buf_len(in_RDI->buf), sVar5 <= uVar2)) {
            uVar2 = *in_RCX;
            *in_RCX = uVar2 + 1;
            bVar1 = in_RSI[uVar2];
          }
          else {
            puVar6 = yajl_buf_data(in_RDI->buf);
            sVar5 = in_RDI->bufOff;
            in_RDI->bufOff = sVar5 + 1;
            bVar1 = puVar6[sVar5];
          }
          if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
               [bVar1] & 4U) == 0) {
            if (*in_RCX == 0) {
              in_RDI->bufOff = in_RDI->bufOff - 1;
            }
            else {
              *in_RCX = *in_RCX - 1;
            }
            in_RDI->error = yajl_lex_string_invalid_hex_char;
            goto LAB_00103c2b;
          }
        }
      }
      else if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
                [bVar1] & 1U) == 0) {
        if (*in_RCX == 0) {
          in_RDI->bufOff = in_RDI->bufOff - 1;
        }
        else {
          *in_RCX = *in_RCX - 1;
        }
        in_RDI->error = yajl_lex_string_invalid_escaped_char;
        goto LAB_00103c2b;
      }
    }
    if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
         [bVar1] & 2U) != 0) break;
    if (in_RDI->validateUTF8 != 0) {
      yVar4 = yajl_lex_utf8_char(in_RDI,in_RSI,in_RDX,in_RCX,'\0');
      if (yVar4 == yajl_tok_eof) {
        yVar8 = yajl_tok_eof;
        goto LAB_00103c2b;
      }
      if (yVar4 == yajl_tok_error) {
        in_RDI->error = yajl_lex_string_invalid_utf8;
LAB_00103c2b:
        if ((bVar3) && (yVar8 == yajl_tok_string)) {
          yVar8 = yajl_tok_string_with_escapes;
        }
        return yVar8;
      }
    }
  }
  if (*in_RCX == 0) {
    in_RDI->bufOff = in_RDI->bufOff - 1;
  }
  else {
    *in_RCX = *in_RCX - 1;
  }
  in_RDI->error = yajl_lex_string_invalid_json_char;
  goto LAB_00103c2b;
}

Assistant:

static yajl_tok
yajl_lex_string(yajl_lexer lexer, const unsigned char * jsonText,
                size_t jsonTextLen, size_t * offset)
{
    yajl_tok tok = yajl_tok_error;
    int hasEscapes = 0;

    for (;;) {
        unsigned char curChar;

        /* now jump into a faster scanning routine to skip as much
         * of the buffers as possible */
        {
            const unsigned char * p;
            size_t len;

            if ((lexer->bufInUse && yajl_buf_len(lexer->buf) &&
                 lexer->bufOff < yajl_buf_len(lexer->buf)))
            {
                p = ((const unsigned char *) yajl_buf_data(lexer->buf) +
                     (lexer->bufOff));
                len = yajl_buf_len(lexer->buf) - lexer->bufOff;
                lexer->bufOff += yajl_string_scan(p, len, lexer->validateUTF8);
            }
            else if (*offset < jsonTextLen)
            {
                p = jsonText + *offset;
                len = jsonTextLen - *offset;
                *offset += yajl_string_scan(p, len, lexer->validateUTF8);
            }
        }

        STR_CHECK_EOF;

        curChar = readChar(lexer, jsonText, offset);

        /* quote terminates */
        if (curChar == '"') {
            tok = yajl_tok_string;
            break;
        }
        /* backslash escapes a set of control chars, */
        else if (curChar == '\\') {
            hasEscapes = 1;
            STR_CHECK_EOF;

            /* special case \u */
            curChar = readChar(lexer, jsonText, offset);
            if (curChar == 'u') {
                unsigned int i = 0;

                for (i=0;i<4;i++) {
                    STR_CHECK_EOF;
                    curChar = readChar(lexer, jsonText, offset);
                    if (!(charLookupTable[curChar] & VHC)) {
                        /* back up to offending char */
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_string_invalid_hex_char;
                        goto finish_string_lex;
                    }
                }
            } else if (!(charLookupTable[curChar] & VEC)) {
                /* back up to offending char */
                unreadChar(lexer, offset);
                lexer->error = yajl_lex_string_invalid_escaped_char;
                goto finish_string_lex;
            }
        }
        /* when not validating UTF8 it's a simple table lookup to determine
         * if the present character is invalid */
        else if(charLookupTable[curChar] & IJC) {
            /* back up to offending char */
            unreadChar(lexer, offset);
            lexer->error = yajl_lex_string_invalid_json_char;
            goto finish_string_lex;
        }
        /* when in validate UTF8 mode we need to do some extra work */
        else if (lexer->validateUTF8) {
            yajl_tok t = yajl_lex_utf8_char(lexer, jsonText, jsonTextLen,
                                            offset, curChar);

            if (t == yajl_tok_eof) {
                tok = yajl_tok_eof;
                goto finish_string_lex;
            } else if (t == yajl_tok_error) {
                lexer->error = yajl_lex_string_invalid_utf8;
                goto finish_string_lex;
            }
        }
        /* accept it, and move on */
    }
  finish_string_lex:
    /* tell our buddy, the parser, wether he needs to process this string
     * again */
    if (hasEscapes && tok == yajl_tok_string) {
        tok = yajl_tok_string_with_escapes;
    }

    return tok;
}